

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_cli.c
# Opt level: O0

int ssl_parse_server_psk_hint(mbedtls_ssl_context *ssl,uchar **p,uchar *end)

{
  uchar uVar1;
  uchar uVar2;
  size_t len;
  int ret;
  uchar *end_local;
  uchar **p_local;
  mbedtls_ssl_context *ssl_local;
  
  uVar1 = **p;
  uVar2 = (*p)[1];
  *p = *p + 2;
  if (end < *p + (int)(uint)CONCAT11(uVar1,uVar2)) {
    mbedtls_debug_print_msg
              (ssl,1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
               ,0x7ca,"bad server key exchange message (psk_identity_hint length)");
    ssl_local._4_4_ = -0x7b00;
  }
  else {
    *p = *p + (int)(uint)CONCAT11(uVar1,uVar2);
    ssl_local._4_4_ = 0;
  }
  return ssl_local._4_4_;
}

Assistant:

static int ssl_parse_server_psk_hint( mbedtls_ssl_context *ssl,
                                      unsigned char **p,
                                      unsigned char *end )
{
    int ret = MBEDTLS_ERR_SSL_FEATURE_UNAVAILABLE;
    size_t  len;
    ((void) ssl);

    /*
     * PSK parameters:
     *
     * opaque psk_identity_hint<0..2^16-1>;
     */
    len = (*p)[0] << 8 | (*p)[1];
    *p += 2;

    if( (*p) + len > end )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad server key exchange message (psk_identity_hint length)" ) );
        return( MBEDTLS_ERR_SSL_BAD_HS_SERVER_KEY_EXCHANGE );
    }

    /*
     * Note: we currently ignore the PKS identity hint, as we only allow one
     * PSK to be provisionned on the client. This could be changed later if
     * someone needs that feature.
     */
    *p += len;
    ret = 0;

    return( ret );
}